

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O2

schar fillholetyp(int x,int y)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  
  uVar2 = 2;
  if (2 < x) {
    uVar2 = (ulong)(uint)x;
  }
  iVar1 = 0x4e;
  if (x < 0x4e) {
    iVar1 = x;
  }
  uVar4 = 1;
  if (1 < y) {
    uVar4 = (ulong)(uint)y;
  }
  iVar5 = 0x13;
  if (y < 0x13) {
    iVar5 = y;
  }
  lVar3 = uVar2 - 1;
  puVar9 = (uint *)((long)level + uVar4 * 0xc + uVar2 * 0xfc + -0xc2);
  iVar7 = 0;
  iVar12 = 0;
  iVar8 = 0;
  iVar6 = 0;
  do {
    puVar10 = puVar9;
    lVar13 = uVar4 - 1;
    if (iVar1 + 1 < lVar3) {
      if ((iVar12 + iVar7 / 3 < iVar8) && (iVar1 = rn2(iVar8 + 1), iVar1 != 0)) {
        return '\x15';
      }
      if ((0 < iVar12) && (iVar1 = rn2(iVar12 + 1), iVar1 != 0)) {
        return '\x12';
      }
      if ((2 < iVar7) && (iVar1 = rn2(iVar7 / 3 + 1), iVar1 != 0)) {
        return '\x11';
      }
      if ((0 < iVar6) && (iVar1 = rn2(iVar6 + 1), iVar1 != 0)) {
        return '#';
      }
      return '\x19';
    }
    for (; lVar13 <= iVar5 + 1; lVar13 = lVar13 + 1) {
      switch(*(char *)((long)puVar10 + -2)) {
      case '\x11':
        iVar7 = iVar7 + 1;
        break;
      case '\x12':
switchD_00162970_caseD_12:
        iVar12 = iVar12 + 1;
        break;
      case '\x13':
        break;
      case '\x14':
        uVar11 = *puVar10 & 0x1c0;
        if (uVar11 == 0x100) {
LAB_001629a2:
          iVar6 = iVar6 + 1;
        }
        else {
          if (uVar11 == 0x40) goto switchD_00162970_caseD_15;
          if (uVar11 == 0) goto switchD_00162970_caseD_12;
        }
        break;
      case '\x15':
switchD_00162970_caseD_15:
        iVar8 = iVar8 + 1;
        break;
      default:
        if (*(char *)((long)puVar10 + -2) == '#') goto LAB_001629a2;
      }
      puVar10 = puVar10 + 3;
    }
    lVar3 = lVar3 + 1;
    puVar9 = puVar9 + 0x3f;
  } while( true );
}

Assistant:

schar fillholetyp(int x, int y)
{
    int x1, y1;
    int lo_x = max(1,x-1), hi_x = min(x+1,COLNO-1),
	lo_y = max(0,y-1), hi_y = min(y+1,ROWNO-1);
    int pool_cnt = 0, moat_cnt = 0, lava_cnt = 0, swamp_cnt = 0;

    /* count the terrain types at and around x,y including those under drawbridges */
    for (x1 = lo_x; x1 <= hi_x; x1++)
	for (y1 = lo_y; y1 <= hi_y; y1++)
	    if (level->locations[x1][y1].typ == POOL)
		pool_cnt++;
	    else if (level->locations[x1][y1].typ == MOAT ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_MOAT))
		moat_cnt++;
	    else if (level->locations[x1][y1].typ == LAVAPOOL ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_LAVA))
		lava_cnt++;
	    else if (level->locations[x1][y1].typ == BOG ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_BOG))
		swamp_cnt++;
    pool_cnt /= 3;		/* not as much liquid as the others */

    if (lava_cnt > moat_cnt + pool_cnt && rn2(lava_cnt + 1))
	return LAVAPOOL;
    else if (moat_cnt > 0 && rn2(moat_cnt + 1))
	return MOAT;
    else if (pool_cnt > 0 && rn2(pool_cnt + 1))
	return POOL;
    else if (swamp_cnt > 0 && rn2(swamp_cnt + 1))
	return BOG;
    else
	return ROOM;
}